

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O1

void __thiscall
AnaylserUnits_compoundEquivalentUnits_Test::~AnaylserUnits_compoundEquivalentUnits_Test
          (AnaylserUnits_compoundEquivalentUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnaylserUnits, compoundEquivalentUnits)
{
    auto m = libcellml::Model::create("compound_units");
    auto c = libcellml::Component::create("main");
    auto a = libcellml::Variable::create("a");
    auto o = libcellml::Variable::create("o");

    auto gas = libcellml::Units::create("gas_constant");
    gas->addUnit(libcellml::Units::StandardUnit::KELVIN, -1.0);
    gas->addUnit(libcellml::Units::StandardUnit::METRE, 3.0);
    gas->addUnit(libcellml::Units::StandardUnit::MOLE, -1.0);
    gas->addUnit(libcellml::Units::StandardUnit::PASCAL);

    auto apple = libcellml::Units::create("apple");
    apple->addUnit(libcellml::Units::StandardUnit::METRE, 3.0);
    apple->addUnit(libcellml::Units::StandardUnit::PASCAL);

    auto orange = libcellml::Units::create("orange");
    orange->addUnit("gas_constant");
    orange->addUnit(libcellml::Units::StandardUnit::KELVIN);
    orange->addUnit(libcellml::Units::StandardUnit::MOLE);

    c->addVariable(a);
    a->setUnits(apple);

    c->addVariable(o);
    o->setUnits(orange);
    o->setInitialValue(3.5);

    m->addUnits(apple);
    m->addUnits(orange);
    m->addUnits(gas);

    m->addComponent(c);

    c->setMath(
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">"
        "  <apply>"
        "    <eq/>"
        "    <ci>a</ci>"
        "    <ci>o</ci>"
        "  </apply>"
        "</math>");

    auto analyser = libcellml::Analyser::create();
    analyser->analyseModel(m);

    EXPECT_EQ(size_t(0), analyser->warningCount());
}